

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O1

void __thiscall
expression_tree::detail::
default_branch<int,_expression_tree::cache_on_assignment,_expression_tree::sequential>::
default_branch(default_branch<int,_expression_tree::cache_on_assignment,_expression_tree::sequential>
               *this,default_branch_t *other)

{
  unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  *puVar1;
  node_impl<int> *pnVar2;
  pointer *__ptr_1;
  pointer *__ptr;
  
  (this->super_node_impl<int>)._vptr_node_impl = (_func_int **)&PTR__default_branch_0011f5e0;
  (this->l)._vptr_node = (_func_int **)&PTR__node_0011ef68;
  puVar1 = &(this->l).impl;
  pnVar2 = (other->l).impl._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl;
  if (pnVar2 == (node_impl<int> *)0x0) {
    (puVar1->_M_t).
    super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl =
         (node_impl<int> *)0x0;
  }
  else {
    (*pnVar2->_vptr_node_impl[2])(puVar1);
  }
  (this->l).parent = (other->l).parent;
  (this->r)._vptr_node = (_func_int **)&PTR__node_0011ef68;
  puVar1 = &(this->r).impl;
  pnVar2 = (other->r).impl._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl;
  if (pnVar2 == (node_impl<int> *)0x0) {
    (puVar1->_M_t).
    super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
    .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl =
         (node_impl<int> *)0x0;
  }
  else {
    (*pnVar2->_vptr_node_impl[2])(puVar1);
  }
  (this->r).parent = (other->r).parent;
  std::function<int_(const_int_&,_const_int_&)>::function(&this->f,&other->f);
  this->constant_ = other->constant_;
  return;
}

Assistant:

default_branch(const default_branch_t& other) : l(other.l), r(other.r) , f(other.f), constant_(other.constant_) {}